

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_util.H
# Opt level: O2

DeviceVector<amrex::BCRec> *
amrex::convertToDeviceVector<amrex::BCRec>
          (DeviceVector<amrex::BCRec> *__return_storage_ptr__,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *v)

{
  size_type a_size;
  
  a_size = (size_type)
           (int)(((long)(v->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                        super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(v->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                       super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x18);
  PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::PODVector(__return_storage_ptr__,a_size);
  memcpy(__return_storage_ptr__->m_data,
         (v->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
         super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
         super__Vector_impl_data._M_start,a_size * 0x18);
  return __return_storage_ptr__;
}

Assistant:

Gpu::DeviceVector<T>
    convertToDeviceVector ( Vector<T> v)
    {
        int ncomp = v.size();
        Gpu::DeviceVector<T> v_d(ncomp);
#ifdef AMREX_USE_GPU
        Gpu::htod_memcpy
#else
	std::memcpy
#endif
	  (v_d.data(), v.data(), sizeof(T)*ncomp);

        return v_d;
    }